

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::append_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *node;
  xml_attribute_struct *header;
  
  node = this->_root;
  if ((node == (xml_node_struct *)0x0) ||
     (((node->header & 7) != 1 && ((node == (xml_node_struct *)0x0 || ((node->header & 7) != 6))))))
  {
    header = (xml_attribute_struct *)0x0;
  }
  else {
    if (node == (xml_node_struct *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                    ,0x205,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const xml_node_struct *)"
                   );
    }
    header = impl::anon_unknown_0::append_attribute_ll
                       (node,*(xml_allocator **)(node->header & 0xffffffffffffffe0));
    if (header != (xml_attribute_struct *)0x0) {
      impl::anon_unknown_0::strcpy_insitu(&header->name,&header->header,0x10,name_);
    }
  }
  return (xml_attribute)header;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? static_cast<xml_node_type>((_root->header & impl::xml_memory_page_type_mask) + 1) : node_null;
	}